

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::ProcessEHRegionBoundary(LinearScan *this,Instr *instr)

{
  Lifetime *spilledRange;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Type *ppLVar5;
  Instr *insertionInstr;
  undefined1 local_50 [8];
  EditingIterator iter;
  
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xba1,"(instr->IsBranchInstr())","instr->IsBranchInstr()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar3 = instr->m_opcode - 0xe7;
  if ((uVar3 < 5) && ((0x13U >> (uVar3 & 0x1f) & 1) != 0)) {
    local_50 = (undefined1  [8])this->activeLiveranges;
    iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
    iter.super_EditingIterator.last = (NodeBase *)&this->activeRegs;
    iter.super_EditingIterator.super_Iterator.list =
         (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_50;
    while( true ) {
      bVar2 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)local_50);
      if (!bVar2) break;
      ppLVar5 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_50);
      insertionInstr = instr;
      if (instr->m_opcode == Leave) {
        insertionInstr = instr->m_prev;
      }
      BVUnitT<unsigned_long>::Clear
                ((BVUnitT<unsigned_long> *)iter.super_EditingIterator.last,(uint)(*ppLVar5)->reg);
      spilledRange = *ppLVar5;
      if ((spilledRange->field_0x9d & 0x20) == 0) {
        this->intRegUsedCount = this->intRegUsedCount - 1;
      }
      else {
        this->floatRegUsedCount = this->floatRegUsedCount - 1;
      }
      SpillLiveRange(this,spilledRange,insertionInstr);
      SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
                ((EditingIterator *)local_50);
    }
  }
  return;
}

Assistant:

void
LinearScan::ProcessEHRegionBoundary(IR::Instr * instr)
{
    Assert(instr->IsBranchInstr());

    if (instr->m_opcode != Js::OpCode::TryCatch && instr->m_opcode != Js::OpCode::TryFinally && instr->m_opcode != Js::OpCode::Leave)
    {
        return;
    }

    // Spill everything upon entry to the try region and upon a Leave.
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, lifetime, this->activeLiveranges, iter)
    {
        IR::Instr* insertionInstr = instr->m_opcode != Js::OpCode::Leave ? instr : instr->m_prev;
        this->activeRegs.Clear(lifetime->reg);
        if (lifetime->IsInt())
        {
            this->intRegUsedCount--;
        }
        else
        {
            this->floatRegUsedCount--;
        }
        this->SpillLiveRange(lifetime, insertionInstr);
        iter.RemoveCurrent();
    }
    NEXT_SLIST_ENTRY_EDITING;
}